

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

char * ImStristr(char *haystack,char *haystack_end,char *needle,char *needle_end)

{
  byte *pbVar1;
  byte bVar2;
  size_t sVar3;
  byte bVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  
  if (needle_end == (char *)0x0) {
    sVar3 = strlen(needle);
    needle_end = needle + sVar3;
  }
  bVar2 = *needle;
  bVar4 = bVar2 & 0x5f;
  if (0x19 < (byte)(bVar2 + 0x9f)) {
    bVar4 = bVar2;
  }
  do {
    if (haystack_end == (char *)0x0) {
      if (*haystack == 0) {
        return (char *)0x0;
      }
    }
    else if (haystack_end <= haystack) {
      return (char *)0x0;
    }
    bVar2 = *haystack;
    bVar6 = bVar2 & 0x5f;
    if (0x19 < (byte)(bVar2 + 0x9f)) {
      bVar6 = bVar2;
    }
    if (bVar6 == bVar4) {
      lVar5 = 1;
      do {
        pbVar1 = (byte *)(needle + lVar5);
        if (needle_end <= pbVar1) break;
        bVar2 = ((byte *)haystack)[lVar5];
        bVar6 = bVar2 & 0x5f;
        if (0x19 < (byte)(bVar2 + 0x9f)) {
          bVar6 = bVar2;
        }
        bVar2 = *pbVar1;
        bVar7 = bVar2 & 0x5f;
        if (0x19 < (byte)(bVar2 + 0x9f)) {
          bVar7 = bVar2;
        }
        lVar5 = lVar5 + 1;
      } while (bVar6 == bVar7);
      if (pbVar1 == (byte *)needle_end) {
        return (char *)(byte *)haystack;
      }
    }
    haystack = (char *)((byte *)haystack + 1);
  } while( true );
}

Assistant:

const char* ImStristr(const char* haystack, const char* haystack_end, const char* needle, const char* needle_end)
{
    if (!needle_end)
        needle_end = needle + strlen(needle);

    const char un0 = (char)ImToUpper(*needle);
    while ((!haystack_end && *haystack) || (haystack_end && haystack < haystack_end))
    {
        if (ImToUpper(*haystack) == un0)
        {
            const char* b = needle + 1;
            for (const char* a = haystack + 1; b < needle_end; a++, b++)
                if (ImToUpper(*a) != ImToUpper(*b))
                    break;
            if (b == needle_end)
                return haystack;
        }
        haystack++;
    }
    return NULL;
}